

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_record.cc
# Opt level: O0

ssl_open_record_t
bssl::tls_open_record
          (SSL *ssl,uint8_t *out_type,Span<unsigned_char> *out,size_t *out_consumed,
          uint8_t *out_alert,Span<unsigned_char> in)

{
  uint64_t seqnum;
  Span<const_unsigned_char> header_00;
  Span<unsigned_char> in_00;
  ushort uVar1;
  uint8_t type_00;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  ssl_open_record_t sVar5;
  pointer pSVar6;
  size_t sVar7;
  size_t sVar8;
  uint8_t *ptr;
  uchar *puVar9;
  size_t in_R9;
  Span<const_unsigned_char> in_01;
  bool local_151;
  Span<const_unsigned_char> local_110;
  Span<unsigned_char> local_100;
  ulong local_f0;
  size_t plaintext_limit;
  undefined1 auStack_e0 [7];
  bool has_padding;
  size_t local_d8;
  uchar *local_d0;
  uchar *local_c8;
  Span<const_unsigned_char> local_c0;
  Span<const_unsigned_char> local_b0;
  uchar *local_a0;
  uchar *local_98;
  Span<unsigned_char> local_90;
  uchar *local_80;
  Span<const_unsigned_char> header;
  CBS body;
  undefined1 uStack_58;
  bool version_ok;
  uint16_t ciphertext_len;
  uint16_t version;
  uint8_t type;
  undefined1 local_48 [8];
  CBS cbs;
  uint8_t *out_alert_local;
  size_t *out_consumed_local;
  Span<unsigned_char> *out_local;
  uint8_t *out_type_local;
  SSL *ssl_local;
  
  *out_consumed = 0;
  if (ssl->s3->read_shutdown == ssl_shutdown_close_notify) {
    ssl_local._4_4_ = ssl_open_record_close_notify;
  }
  else {
    cbs.len = (size_t)out_alert;
    bVar2 = tls_can_accept_handshake_data(ssl,out_alert);
    if (bVar2) {
      Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                ((Span<unsigned_char_const> *)&uStack_58,&in);
      cbs_st::cbs_st((cbs_st *)local_48,_uStack_58);
      iVar4 = CBS_get_u8((CBS *)local_48,(uint8_t *)((long)&body.len + 7));
      if (((iVar4 == 0) ||
          (iVar4 = CBS_get_u16((CBS *)local_48,(uint16_t *)((long)&body.len + 4)), iVar4 == 0)) ||
         (iVar4 = CBS_get_u16((CBS *)local_48,(uint16_t *)((long)&body.len + 2)), iVar4 == 0)) {
        *out_consumed = 5;
        ssl_local._4_4_ = ssl_open_record_partial;
      }
      else {
        pSVar6 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                           (&ssl->s3->aead_read_ctx);
        bVar2 = SSLAEADContext::is_null_cipher(pSVar6);
        uVar1 = body.len._4_2_;
        if (bVar2) {
          body.len._1_1_ = (int)(uint)body.len._4_2_ >> 8 == 3;
        }
        else {
          uVar3 = tls_record_version(ssl);
          body.len._1_1_ = uVar1 == uVar3;
        }
        if ((bool)body.len._1_1_ == false) {
          ERR_put_error(0x10,0,0xf7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                        ,0x7f);
          *(undefined1 *)cbs.len = 0x46;
          ssl_local._4_4_ = ssl_open_record_error;
        }
        else if (body.len._2_2_ < 0x4141) {
          iVar4 = CBS_get_bytes((CBS *)local_48,(CBS *)&header.size_,(ulong)body.len._2_2_);
          if (iVar4 == 0) {
            *out_consumed = (ulong)body.len._2_2_ + 5;
            ssl_local._4_4_ = ssl_open_record_partial;
          }
          else {
            local_90 = Span<unsigned_char>::subspan(&in,0,5);
            Span<unsigned_char_const>::
            Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                      ((Span<unsigned_char_const> *)&local_80,&local_90);
            local_a0 = local_80;
            local_98 = header.data_;
            in_01.size_ = in_R9;
            in_01.data_ = header.data_;
            ssl_do_msg_callback((bssl *)ssl,(SSL *)0x0,0x100,(int)local_80,in_01);
            sVar7 = Span<unsigned_char>::size(&in);
            sVar8 = CBS_len((CBS *)local_48);
            *out_consumed = sVar7 - sVar8;
            bVar2 = ssl_has_final_version(ssl);
            if (((bVar2) && (uVar3 = ssl_protocol_version(ssl), 0x303 < uVar3)) &&
               ((iVar4 = SSL_in_init(ssl), iVar4 != 0 && (body.len._7_1_ == '\x14')))) {
              local_b0 = cbs_st::operator_cast_to_Span((cbs_st *)&header.size_);
              Span<unsigned_char_const>::Span<1ul>
                        ((Span<unsigned_char_const> *)&local_c0,(uchar (*) [1])"\x01");
              bVar2 = internal::operator==(local_b0,local_c0);
              if (bVar2) {
                ssl->s3->empty_record_count = ssl->s3->empty_record_count + '\x01';
                if (0x20 < ssl->s3->empty_record_count) {
                  ERR_put_error(0x10,0,0xdb,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                                ,0x9f);
                  *(undefined1 *)cbs.len = 10;
                  return ssl_open_record_error;
                }
                return ssl_open_record_discard;
              }
            }
            if ((*(ushort *)&ssl->s3->field_0xdc & 1) != 0) {
              pSVar6 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                                 (&ssl->s3->aead_read_ctx);
              bVar2 = SSLAEADContext::is_null_cipher(pSVar6);
              if ((bVar2) && (body.len._7_1_ == '\x17')) {
                sVar5 = skip_early_data(ssl,(uint8_t *)cbs.len,*out_consumed);
                return sVar5;
              }
            }
            if (ssl->s3->read_sequence == 0xffffffffffffffff) {
              ERR_put_error(0x10,0,0x45,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                            ,0xb0);
              *(undefined1 *)cbs.len = 0x50;
              ssl_local._4_4_ = ssl_open_record_error;
            }
            else {
              pSVar6 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                                 (&ssl->s3->aead_read_ctx);
              type_00 = body.len._7_1_;
              seqnum = ssl->s3->read_sequence;
              local_d0 = local_80;
              local_c8 = header.data_;
              ptr = CBS_data((CBS *)&header.size_);
              sVar7 = CBS_len((CBS *)&header.size_);
              Span<unsigned_char>::Span((Span<unsigned_char> *)auStack_e0,ptr,sVar7);
              header_00.size_ = (size_t)local_c8;
              header_00.data_ = local_d0;
              in_00.size_ = local_d8;
              in_00.data_ = _auStack_e0;
              bVar2 = SSLAEADContext::Open(pSVar6,out,type_00,body.len._4_2_,seqnum,header_00,in_00)
              ;
              if (bVar2) {
                *(ushort *)&ssl->s3->field_0xdc = *(ushort *)&ssl->s3->field_0xdc & 0xfffe;
                ssl->s3->read_sequence = ssl->s3->read_sequence + 1;
                pSVar6 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                                   (&ssl->s3->aead_read_ctx);
                bVar2 = SSLAEADContext::is_null_cipher(pSVar6);
                local_151 = false;
                if (!bVar2) {
                  uVar3 = ssl_protocol_version(ssl);
                  local_151 = 0x303 < uVar3;
                }
                plaintext_limit._7_1_ = local_151;
                iVar4 = 0x4000;
                if (local_151 != false) {
                  iVar4 = 0x4001;
                }
                local_f0 = (ulong)iVar4;
                sVar7 = Span<unsigned_char>::size(out);
                if (local_f0 < sVar7) {
                  ERR_put_error(0x10,0,0x88,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                                ,0xcf);
                  *(undefined1 *)cbs.len = 0x16;
                  ssl_local._4_4_ = ssl_open_record_error;
                }
                else {
                  if ((plaintext_limit._7_1_ & 1) != 0) {
                    if (body.len._7_1_ != '\x17') {
                      ERR_put_error(0x10,0,0xfb,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                                    ,0xd7);
                      *(undefined1 *)cbs.len = 0x32;
                      return ssl_open_record_error;
                    }
                    do {
                      bVar2 = Span<unsigned_char>::empty(out);
                      if (bVar2) {
                        ERR_put_error(0x10,0,0x8b,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                                      ,0xde);
                        *(undefined1 *)cbs.len = 0x33;
                        return ssl_open_record_error;
                      }
                      puVar9 = Span<unsigned_char>::back(out);
                      body.len._7_1_ = *puVar9;
                      sVar7 = Span<unsigned_char>::size(out);
                      local_100 = Span<unsigned_char>::subspan(out,0,sVar7 - 1);
                      out->data_ = local_100.data_;
                      out->size_ = local_100.size_;
                    } while (body.len._7_1_ == '\0');
                  }
                  bVar2 = Span<unsigned_char>::empty(out);
                  sVar7 = cbs.len;
                  if (bVar2) {
                    ssl->s3->empty_record_count = ssl->s3->empty_record_count + '\x01';
                    if (0x20 < ssl->s3->empty_record_count) {
                      ERR_put_error(0x10,0,0xdb,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                                    ,0xeb);
                      *(undefined1 *)cbs.len = 10;
                      return ssl_open_record_error;
                    }
                  }
                  else {
                    ssl->s3->empty_record_count = '\0';
                  }
                  if (body.len._7_1_ == '\x15') {
                    Span<unsigned_char_const>::
                    Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                              ((Span<unsigned_char_const> *)&local_110,out);
                    ssl_local._4_4_ = ssl_process_alert(ssl,(uint8_t *)sVar7,local_110);
                  }
                  else if ((body.len._7_1_ == '\x16') ||
                          (bVar2 = tls_has_unprocessed_handshake_data(ssl), !bVar2)) {
                    ssl->s3->warning_alert_count = '\0';
                    *out_type = body.len._7_1_;
                    ssl_local._4_4_ = ssl_open_record_success;
                  }
                  else {
                    ERR_put_error(0x10,0,0xe1,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                                  ,0xfc);
                    *(undefined1 *)cbs.len = 10;
                    ssl_local._4_4_ = ssl_open_record_error;
                  }
                }
              }
              else {
                if ((*(ushort *)&ssl->s3->field_0xdc & 1) != 0) {
                  pSVar6 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::
                           operator->(&ssl->s3->aead_read_ctx);
                  bVar2 = SSLAEADContext::is_null_cipher(pSVar6);
                  if (!bVar2) {
                    ERR_clear_error();
                    sVar5 = skip_early_data(ssl,(uint8_t *)cbs.len,*out_consumed);
                    return sVar5;
                  }
                }
                ERR_put_error(0x10,0,0x8b,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                              ,0xbe);
                *(undefined1 *)cbs.len = 0x14;
                ssl_local._4_4_ = ssl_open_record_error;
              }
            }
          }
        }
        else {
          ERR_put_error(0x10,0,0x92,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                        ,0x86);
          *(undefined1 *)cbs.len = 0x16;
          ssl_local._4_4_ = ssl_open_record_error;
        }
      }
    }
    else {
      ssl_local._4_4_ = ssl_open_record_error;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

ssl_open_record_t tls_open_record(SSL *ssl, uint8_t *out_type,
                                  Span<uint8_t> *out, size_t *out_consumed,
                                  uint8_t *out_alert, Span<uint8_t> in) {
  *out_consumed = 0;
  if (ssl->s3->read_shutdown == ssl_shutdown_close_notify) {
    return ssl_open_record_close_notify;
  }

  // If there is an unprocessed handshake message or we are already buffering
  // too much, stop before decrypting another handshake record.
  if (!tls_can_accept_handshake_data(ssl, out_alert)) {
    return ssl_open_record_error;
  }

  CBS cbs = CBS(in);

  // Decode the record header.
  uint8_t type;
  uint16_t version, ciphertext_len;
  if (!CBS_get_u8(&cbs, &type) ||      //
      !CBS_get_u16(&cbs, &version) ||  //
      !CBS_get_u16(&cbs, &ciphertext_len)) {
    *out_consumed = SSL3_RT_HEADER_LENGTH;
    return ssl_open_record_partial;
  }

  bool version_ok;
  if (ssl->s3->aead_read_ctx->is_null_cipher()) {
    // Only check the first byte. Enforcing beyond that can prevent decoding
    // version negotiation failure alerts.
    version_ok = (version >> 8) == SSL3_VERSION_MAJOR;
  } else {
    version_ok = version == tls_record_version(ssl);
  }

  if (!version_ok) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_WRONG_VERSION_NUMBER);
    *out_alert = SSL_AD_PROTOCOL_VERSION;
    return ssl_open_record_error;
  }

  // Check the ciphertext length.
  if (ciphertext_len > SSL3_RT_MAX_ENCRYPTED_LENGTH) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_ENCRYPTED_LENGTH_TOO_LONG);
    *out_alert = SSL_AD_RECORD_OVERFLOW;
    return ssl_open_record_error;
  }

  // Extract the body.
  CBS body;
  if (!CBS_get_bytes(&cbs, &body, ciphertext_len)) {
    *out_consumed = SSL3_RT_HEADER_LENGTH + (size_t)ciphertext_len;
    return ssl_open_record_partial;
  }

  Span<const uint8_t> header = in.subspan(0, SSL3_RT_HEADER_LENGTH);
  ssl_do_msg_callback(ssl, 0 /* read */, SSL3_RT_HEADER, header);

  *out_consumed = in.size() - CBS_len(&cbs);

  // In TLS 1.3, during the handshake, skip ChangeCipherSpec records.
  static const uint8_t kChangeCipherSpec[] = {SSL3_MT_CCS};
  if (ssl_has_final_version(ssl) &&
      ssl_protocol_version(ssl) >= TLS1_3_VERSION && SSL_in_init(ssl) &&
      type == SSL3_RT_CHANGE_CIPHER_SPEC &&
      Span<const uint8_t>(body) == kChangeCipherSpec) {
    ssl->s3->empty_record_count++;
    if (ssl->s3->empty_record_count > kMaxEmptyRecords) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_TOO_MANY_EMPTY_FRAGMENTS);
      *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
      return ssl_open_record_error;
    }
    return ssl_open_record_discard;
  }

  // Skip early data received when expecting a second ClientHello if we rejected
  // 0RTT.
  if (ssl->s3->skip_early_data &&                  //
      ssl->s3->aead_read_ctx->is_null_cipher() &&  //
      type == SSL3_RT_APPLICATION_DATA) {
    return skip_early_data(ssl, out_alert, *out_consumed);
  }

  // Ensure the sequence number update does not overflow.
  if (ssl->s3->read_sequence + 1 == 0) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return ssl_open_record_error;
  }

  // Decrypt the body in-place.
  if (!ssl->s3->aead_read_ctx->Open(
          out, type, version, ssl->s3->read_sequence, header,
          Span(const_cast<uint8_t *>(CBS_data(&body)), CBS_len(&body)))) {
    if (ssl->s3->skip_early_data && !ssl->s3->aead_read_ctx->is_null_cipher()) {
      ERR_clear_error();
      return skip_early_data(ssl, out_alert, *out_consumed);
    }

    OPENSSL_PUT_ERROR(SSL, SSL_R_DECRYPTION_FAILED_OR_BAD_RECORD_MAC);
    *out_alert = SSL_AD_BAD_RECORD_MAC;
    return ssl_open_record_error;
  }

  ssl->s3->skip_early_data = false;
  ssl->s3->read_sequence++;

  // TLS 1.3 hides the record type inside the encrypted data.
  bool has_padding = !ssl->s3->aead_read_ctx->is_null_cipher() &&
                     ssl_protocol_version(ssl) >= TLS1_3_VERSION;

  // If there is padding, the plaintext limit includes the padding, but includes
  // extra room for the inner content type.
  size_t plaintext_limit =
      has_padding ? SSL3_RT_MAX_PLAIN_LENGTH + 1 : SSL3_RT_MAX_PLAIN_LENGTH;
  if (out->size() > plaintext_limit) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DATA_LENGTH_TOO_LONG);
    *out_alert = SSL_AD_RECORD_OVERFLOW;
    return ssl_open_record_error;
  }

  if (has_padding) {
    // The outer record type is always application_data.
    if (type != SSL3_RT_APPLICATION_DATA) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_OUTER_RECORD_TYPE);
      *out_alert = SSL_AD_DECODE_ERROR;
      return ssl_open_record_error;
    }

    do {
      if (out->empty()) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_DECRYPTION_FAILED_OR_BAD_RECORD_MAC);
        *out_alert = SSL_AD_DECRYPT_ERROR;
        return ssl_open_record_error;
      }
      type = out->back();
      *out = out->subspan(0, out->size() - 1);
    } while (type == 0);
  }

  // Limit the number of consecutive empty records.
  if (out->empty()) {
    ssl->s3->empty_record_count++;
    if (ssl->s3->empty_record_count > kMaxEmptyRecords) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_TOO_MANY_EMPTY_FRAGMENTS);
      *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
      return ssl_open_record_error;
    }
    // Apart from the limit, empty records are returned up to the caller. This
    // allows the caller to reject records of the wrong type.
  } else {
    ssl->s3->empty_record_count = 0;
  }

  if (type == SSL3_RT_ALERT) {
    return ssl_process_alert(ssl, out_alert, *out);
  }

  // Handshake messages may not interleave with any other record type.
  if (type != SSL3_RT_HANDSHAKE &&  //
      tls_has_unprocessed_handshake_data(ssl)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_RECORD);
    *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
    return ssl_open_record_error;
  }

  ssl->s3->warning_alert_count = 0;

  *out_type = type;
  return ssl_open_record_success;
}